

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::set_error(torrent *this,error_code *ec,file_index_t error_file)

{
  error_category *peVar1;
  bool bVar2;
  undefined3 uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char buf [1024];
  undefined1 local_468 [32];
  string local_448;
  string local_428 [32];
  
  bVar2 = ec->failed_;
  uVar3 = *(undefined3 *)&ec->field_0x5;
  peVar1 = ec->cat_;
  (this->m_error).val_ = ec->val_;
  (this->m_error).failed_ = bVar2;
  *(undefined3 *)&(this->m_error).field_0x5 = uVar3;
  (this->m_error).cat_ = peVar1;
  (this->m_error_file).m_val = error_file.m_val;
  update_gauge(this);
  iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  if ((*(uint *)(CONCAT44(extraout_var,iVar4) + 0x68) & 0x41) != 0) {
    iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)local_468);
    resolve_filename_abi_cxx11_(local_428,this,error_file);
    alert_manager::
    emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code_const&,std::__cxx11::string>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar4),(torrent_handle *)local_468,ec,
               local_428);
    ::std::__cxx11::string::~string((string *)local_428);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_468 + 8));
  }
  if (ec->failed_ == true) {
    (*ec->cat_->_vptr_error_category[4])(local_468,ec->cat_,(ulong)(uint)ec->val_);
    resolve_filename_abi_cxx11_((string *)(local_468 + 0x20),this,error_file);
    snprintf((char *)local_428,0x400,"error %s: %s",local_468._0_8_,local_448._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)(local_468 + 0x20));
    ::std::__cxx11::string::~string((string *)local_468);
    log_to_all_peers(this,(char *)local_428);
  }
  state_updated(this);
  update_state_list(this);
  return;
}

Assistant:

void torrent::set_error(error_code const& ec, file_index_t const error_file)
	{
		TORRENT_ASSERT(is_single_thread());
		m_error = ec;
		m_error_file = error_file;

		update_gauge();

		if (alerts().should_post<torrent_error_alert>())
			alerts().emplace_alert<torrent_error_alert>(get_handle(), ec
				, resolve_filename(error_file));

#ifndef TORRENT_DISABLE_LOGGING
		if (ec)
		{
			char buf[1024];
			std::snprintf(buf, sizeof(buf), "error %s: %s", ec.message().c_str()
				, resolve_filename(error_file).c_str());
			log_to_all_peers(buf);
		}
#endif

		state_updated();
		update_state_list();
	}